

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O1

Response dispatch_command(Command *cmd,Task *task,DatabaseSnapshot *snap)

{
  undefined8 *puVar1;
  long lVar2;
  json_value extraout_RDX;
  Response RVar3;
  undefined8 local_10;
  
  lVar2 = (long)*(char *)&task[5].changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
  local_10 = snap;
  if (lVar2 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<Response>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Daemon.cpp:221:9)_&&,_const_std::variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>_&>
      ::_S_vtable._M_arr[lVar2]._M_data)
              ((anon_class_16_2_3fdaa394 *)cmd,
               (variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
                *)&stack0xffffffffffffffe8);
    RVar3.content.m_value.object = extraout_RDX.object;
    RVar3.content._0_8_ = cmd;
    return (Response)RVar3.content;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_001ed658;
  puVar1[1] = "std::visit: variant is valueless";
  __cxa_throw(puVar1,&std::bad_variant_access::typeinfo,std::exception::~exception);
}

Assistant:

Response dispatch_command(const Command &cmd, Task *task,
                          const DatabaseSnapshot *snap) {
    return std::visit(
        [snap, task](const auto &cmd) {
            return execute_command(cmd, task, snap);
        },
        cmd);
}